

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testutil.h
# Opt level: O1

int test_bind_impl(char *file,int line,int sock,char *address)

{
  int iVar1;
  
  iVar1 = nn_bind(line,"inproc://a");
  if (-1 < iVar1) {
    return iVar1;
  }
  test_bind_impl_cold_1();
}

Assistant:

static int NN_UNUSED test_bind_impl (char *file, int line,
    int sock, char *address)
{
    int rc;

    rc = nn_bind (sock, address);
    if(rc < 0) {
        fprintf (stderr, "Failed bind to \"%s\": %s [%d] (%s:%d)\n",
            address,
            nn_err_strerror (errno),
            (int) errno, file, line);
        nn_err_abort ();
    }
    return rc;
}